

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int tx_get_lengths(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,size_t *base_size,
                  size_t *witness_size,size_t *witness_count,_Bool is_elements)

{
  uint uVar1;
  wally_tx_input *pwVar2;
  wally_tx_witness_stack *pwVar3;
  wally_tx_output *pwVar4;
  _Bool _Var5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  size_t *psVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  uint64_t uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  byte bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  byte local_58;
  
  if (opts == (tx_serialize_opts *)0x0) {
    bVar20 = false;
    bVar19 = 0;
    local_58 = 0;
    bVar21 = false;
  }
  else {
    uVar1 = opts->sighash;
    bVar19 = (byte)(uVar1 >> 7) & 1;
    local_58 = (byte)((uVar1 & 0x40) >> 6);
    bVar20 = (uVar1 & 0x1f) == 2;
    bVar21 = (uVar1 & 0x1f) == 3;
  }
  *witness_count = 0;
  _Var5 = is_valid_tx(tx);
  if (!_Var5) {
    return -2;
  }
  if (opts == (tx_serialize_opts *)0x0) {
LAB_004028e7:
    if (0xf < flags) {
      return -2;
    }
    bVar22 = true;
    if ((flags & 1) != 0) {
      iVar6 = wally_tx_get_witness_count(tx,witness_count);
      if (iVar6 != 0) {
        return -2;
      }
      bVar22 = *witness_count == 0;
    }
    sVar7 = 1;
    if (bVar19 == 0) {
      sVar7 = tx->num_inputs;
    }
    sVar8 = varint_get_length(sVar7);
    sVar7 = 1;
    if (!bVar20) {
      if (bVar21) {
        sVar7 = opts->index + 1;
      }
      else {
        sVar7 = tx->num_outputs;
      }
      sVar7 = varint_get_length(sVar7);
    }
    sVar7 = sVar7 + sVar8 + (ulong)(opts == (tx_serialize_opts *)0x0 && is_elements) +
                            (ulong)(opts != (tx_serialize_opts *)0x0) * 4 + 8;
    lVar9 = 0x98;
    for (uVar18 = 0; uVar18 < tx->num_inputs; uVar18 = uVar18 + 1) {
      pwVar2 = tx->inputs;
      if ((bVar19 == 0) || (uVar18 == opts->index)) {
        if ((pwVar2->txhash[lVar9 + -0x58] & 2) == 0) {
          lVar17 = sVar7 + 0x28;
        }
        else {
          sVar8 = confidential_value_length_from_bytes(*(uchar **)(pwVar2->txhash + lVar9 + -0x10));
          sVar10 = confidential_value_length_from_bytes(*(uchar **)(pwVar2->txhash + lVar9));
          lVar17 = sVar10 + sVar7 + sVar8 + 0x68;
        }
        if (opts == (tx_serialize_opts *)0x0) {
          psVar11 = (size_t *)(pwVar2->txhash + lVar9 + -0x68);
LAB_00402aa3:
          sVar7 = varbuff_get_length(*psVar11);
        }
        else {
          sVar7 = 1;
          psVar11 = &opts->script_len;
          if (uVar18 == opts->index) goto LAB_00402aa3;
        }
        sVar7 = sVar7 + lVar17;
      }
      lVar9 = lVar9 + 0xd0;
    }
    if (!bVar20) {
      if (bVar21) {
        sVar8 = opts->index + 1;
      }
      else {
        sVar8 = tx->num_outputs;
      }
      lVar9 = 0x10;
      for (sVar10 = 0; sVar8 != sVar10; sVar10 = sVar10 + 1) {
        pwVar4 = tx->outputs;
        if ((bVar21) && (sVar10 != opts->index)) {
          sVar7 = sVar7 + 9;
        }
        else {
          if (is_elements) {
            lVar17 = 8;
            bVar19 = local_58;
            if ((*(byte *)((long)&pwVar4->script + lVar9) & 1) != 0) {
              sVar12 = confidential_asset_length_from_bytes
                                 (*(uchar **)((long)&pwVar4->script_len + lVar9));
              sVar13 = confidential_value_length_from_bytes
                                 (*(uchar **)((long)&pwVar4->asset + lVar9));
              sVar14 = confidential_nonce_length_from_bytes
                                 (*(uchar **)((long)&pwVar4->value + lVar9));
              lVar17 = sVar14 + sVar13 + sVar12;
            }
          }
          else {
            bVar19 = 0;
            lVar17 = 8;
          }
          sVar12 = varbuff_get_length(*(size_t *)((long)&pwVar4->satoshi + lVar9));
          sVar7 = sVar12 + lVar17 + sVar7;
          if (bVar19 != 0) {
            sVar12 = varbuff_get_length(*(size_t *)((long)&pwVar4->surjectionproof_len + lVar9));
            sVar13 = varbuff_get_length(*(size_t *)((long)&pwVar4->nonce_len + lVar9));
            sVar7 = sVar7 + sVar13 + sVar12;
          }
        }
        lVar9 = lVar9 + 0x70;
      }
    }
    *base_size = sVar7;
    if ((flags & 1) != 0 && !bVar22) {
      if (is_elements) {
        sVar7 = 0;
        for (uVar18 = 0; uVar18 < tx->num_inputs; uVar18 = uVar18 + 1) {
          pwVar2 = tx->inputs;
          sVar8 = varbuff_get_length(pwVar2[uVar18].issuance_amount_rangeproof_len);
          sVar10 = varbuff_get_length(pwVar2[uVar18].inflation_keys_rangeproof_len);
          if (pwVar2[uVar18].witness == (wally_tx_witness_stack *)0x0) {
            uVar15 = 0;
          }
          else {
            uVar15 = (pwVar2[uVar18].witness)->num_items;
          }
          sVar12 = varint_get_length(uVar15);
          lVar16 = sVar12 + sVar8 + sVar7 + sVar10;
          lVar9 = 8;
          lVar17 = lVar9;
          while (bVar20 = uVar15 != 0, uVar15 = uVar15 - 1, bVar20) {
            sVar7 = varbuff_get_length(*(size_t *)
                                        ((long)&(pwVar2[uVar18].witness)->items->witness + lVar17));
            lVar16 = lVar16 + sVar7;
            lVar17 = lVar17 + 0x10;
          }
          if (pwVar2[uVar18].pegin_witness == (wally_tx_witness_stack *)0x0) {
            uVar15 = 0;
          }
          else {
            uVar15 = (pwVar2[uVar18].pegin_witness)->num_items;
          }
          sVar7 = varint_get_length(uVar15);
          sVar7 = sVar7 + lVar16;
          while (bVar20 = uVar15 != 0, uVar15 = uVar15 - 1, bVar20) {
            sVar8 = varbuff_get_length(*(size_t *)
                                        ((long)&(pwVar2[uVar18].pegin_witness)->items->witness +
                                        lVar9));
            sVar7 = sVar7 + sVar8;
            lVar9 = lVar9 + 0x10;
          }
        }
        lVar9 = 0x68;
        for (uVar18 = 0; uVar18 < tx->num_outputs; uVar18 = uVar18 + 1) {
          pwVar4 = tx->outputs;
          sVar8 = varbuff_get_length(*(size_t *)((long)pwVar4 + lVar9 + -0x10));
          sVar10 = varbuff_get_length(*(size_t *)((long)&pwVar4->satoshi + lVar9));
          sVar7 = sVar10 + sVar8 + sVar7;
          lVar9 = lVar9 + 0x70;
        }
      }
      else {
        sVar7 = 2;
        for (uVar18 = 0; uVar18 < tx->num_inputs; uVar18 = uVar18 + 1) {
          pwVar2 = tx->inputs;
          pwVar3 = pwVar2[uVar18].witness;
          if (pwVar3 == (wally_tx_witness_stack *)0x0) {
            uVar15 = 0;
          }
          else {
            uVar15 = pwVar3->num_items;
          }
          sVar8 = varint_get_length(uVar15);
          sVar7 = sVar7 + sVar8;
          lVar9 = 8;
          while (bVar20 = uVar15 != 0, uVar15 = uVar15 - 1, bVar20) {
            sVar8 = varbuff_get_length(*(size_t *)
                                        ((long)&(pwVar2[uVar18].witness)->items->witness + lVar9));
            sVar7 = sVar7 + sVar8;
            lVar9 = lVar9 + 0x10;
          }
        }
      }
      goto LAB_00402d86;
    }
  }
  else {
    if ((flags & 1) != 0) {
      return -1;
    }
    if (opts->bip143 != true) goto LAB_004028e7;
    sVar7 = varbuff_get_length(opts->script_len);
    if (is_elements) {
      sVar8 = confidential_value_length_from_bytes(opts->value);
      lVar9 = sVar8 + 0x20;
      lVar17 = (ulong)local_58 << 5;
    }
    else {
      lVar9 = 8;
      lVar17 = 0;
    }
    *base_size = lVar9 + sVar7 + lVar17 + 0x94;
    if ((tx->inputs[opts->index].features & 2) != 0) {
      sVar7 = confidential_value_length_from_bytes(tx->inputs[opts->index].issuance_amount);
      sVar8 = confidential_value_length_from_bytes(tx->inputs[opts->index].inflation_keys);
      *base_size = sVar8 + sVar7 + *base_size + 0x40;
    }
  }
  sVar7 = 0;
LAB_00402d86:
  *witness_size = sVar7;
  return 0;
}

Assistant:

static int tx_get_lengths(const struct wally_tx *tx,
                          const struct tx_serialize_opts *opts, uint32_t flags,
                          size_t *base_size, size_t *witness_size,
                          size_t *witness_count, bool is_elements)
{
    size_t n, i, j;
    const bool anyonecanpay = opts && opts->sighash & WALLY_SIGHASH_ANYONECANPAY;
    const bool sh_rangeproof = opts && opts->sighash & WALLY_SIGHASH_RANGEPROOF;
    const bool sh_none = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_NONE;
    const bool sh_single = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_SINGLE;

    *witness_count = 0;

    if (!is_valid_tx(tx))
        return WALLY_EINVAL;

    if (opts) {
        if (flags & WALLY_TX_FLAG_USE_WITNESS)
            return WALLY_ERROR; /* Segwit tx hashing uses bip143 opts member */

        if (opts->bip143) {
            *base_size = sizeof(uint32_t) + /* version */
                         SHA256_LEN + /* hash prevouts */
                         SHA256_LEN + /* hash sequence */
                         WALLY_TXHASH_LEN + sizeof(uint32_t) + /* outpoint + index */
                         varbuff_get_length(opts->script_len) + /* script */
                         (is_elements ? confidential_value_length_from_bytes(opts->value) + SHA256_LEN :
                          sizeof(uint64_t)) + /* amount */
                         sizeof(uint32_t) + /* input sequence */
                         SHA256_LEN + /* hash outputs */
                         ((is_elements && sh_rangeproof) ? SHA256_LEN : 0) + /* rangeproof */
                         sizeof(uint32_t) + /* nlocktime */
                         sizeof(uint32_t); /* tx sighash */
#ifdef BUILD_ELEMENTS
            if (tx->inputs[opts->index].features & WALLY_TX_IS_ISSUANCE)
                *base_size += 2 * WALLY_TX_ASSET_TAG_LEN +
                              confidential_value_length_from_bytes(tx->inputs[opts->index].issuance_amount) +
                              confidential_value_length_from_bytes(tx->inputs[opts->index].inflation_keys);
#endif
            *witness_size = 0;
            return WALLY_OK;
        }
    }

    if ((flags & ~WALLY_TX_ALL_FLAGS) ||
        ((flags & WALLY_TX_FLAG_USE_WITNESS) &&
         wally_tx_get_witness_count(tx, witness_count) != WALLY_OK))
        return WALLY_EINVAL;

    if (!*witness_count)
        flags &= ~WALLY_TX_FLAG_USE_WITNESS;

    n = sizeof(tx->version) +
        varint_get_length(anyonecanpay ? 1 : tx->num_inputs) +
        (sh_none ? 1 : varint_get_length(sh_single ? opts->index + 1 : tx->num_outputs)) +
        sizeof(tx->locktime) +
        (opts ? sizeof(leint32_t) : 0); /* Include trailing tx_sighash */

    if (!opts && is_elements)
        n += sizeof(uint8_t); /* witness flag */
    for (i = 0; i < tx->num_inputs; ++i) {
        const struct wally_tx_input *input = tx->inputs + i;
        if (anyonecanpay && i != opts->index)
            continue; /* anyonecanpay only signs the given index */

        n += sizeof(input->txhash) +
             sizeof(input->index) +
             sizeof(input->sequence);

#ifdef BUILD_ELEMENTS
        if (input->features & WALLY_TX_IS_ISSUANCE) {
            n += sizeof(input->blinding_nonce) +
                 sizeof(input->entropy) +
                 confidential_value_length_from_bytes(input->issuance_amount) +
                 confidential_value_length_from_bytes(input->inflation_keys);
        }
#endif

        if (opts) {
            if (i == opts->index)
                n += varbuff_get_length(opts->script_len);
            else
                ++n;
        } else
            n += varbuff_get_length(input->script_len);

    }

    if (!sh_none) {
        size_t num_outputs = sh_single ? opts->index + 1 : tx->num_outputs;

        for (i = 0; i < num_outputs; ++i) {
            const struct wally_tx_output *output = tx->outputs + i;
            if (sh_single && i != opts->index)
                n += sizeof(EMPTY_OUTPUT);
            else {
                if (is_elements && (output->features & WALLY_TX_IS_ELEMENTS)) {
#ifdef BUILD_ELEMENTS
                    n += confidential_asset_length_from_bytes(output->asset) +
                         confidential_value_length_from_bytes(output->value) +
                         confidential_nonce_length_from_bytes(output->nonce);
#endif
                } else
                    n += sizeof(output->satoshi);
                n += varbuff_get_length(output->script_len);

#ifdef BUILD_ELEMENTS
                if (is_elements && sh_rangeproof) {
                    n += varbuff_get_length(output->rangeproof_len) +
                         varbuff_get_length(output->surjectionproof_len);
                }
#endif /* BUILD_ELEMENTS */
            }
        }
    }

    *base_size = n;

    n = 0;
    if (flags & WALLY_TX_FLAG_USE_WITNESS) {
        if (is_elements) {
#ifdef BUILD_ELEMENTS
            for (i = 0; i < tx->num_inputs; ++i) {
                const struct wally_tx_input *input = tx->inputs + i;
                size_t num_items;
                n += varbuff_get_length(input->issuance_amount_rangeproof_len);
                n += varbuff_get_length(input->inflation_keys_rangeproof_len);
                num_items = input->witness ? input->witness->num_items : 0;
                n += varint_get_length(num_items);
                for (j = 0; j < num_items; ++j) {
                    const struct wally_tx_witness_item *stack;
                    stack = input->witness->items + j;
                    n += varbuff_get_length(stack->witness_len);
                }
                num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
                n += varint_get_length(num_items);
                for (j = 0; j < num_items; ++j) {
                    const struct wally_tx_witness_item *stack;
                    stack = input->pegin_witness->items + j;
                    n += varbuff_get_length(stack->witness_len);
                }
            }

            for (i = 0; i < tx->num_outputs; ++i) {
                const struct wally_tx_output *output = tx->outputs + i;
                n += varbuff_get_length(output->surjectionproof_len);
                n += varbuff_get_length(output->rangeproof_len);
            }
#endif /* BUILD_ELEMENTS */
        } else {
            n = 2; /* For marker and flag bytes 0x00 0x01 */

            for (i = 0; i < tx->num_inputs; ++i) {
                const struct wally_tx_input *input = tx->inputs + i;
                size_t num_items = input->witness ? input->witness->num_items : 0;
                n += varint_get_length(num_items);
                for (j = 0; j < num_items; ++j) {
                    const struct wally_tx_witness_item *stack;
                    stack = input->witness->items + j;
                    n += varbuff_get_length(stack->witness_len);
                }
            }
        }
    }

    *witness_size = n;
    return WALLY_OK;
}